

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O1

void __thiscall PressDelayHandler::pressed(PressDelayHandler *this,QEvent *e,int delay)

{
  QMouseEvent *pQVar1;
  Data *pDVar2;
  undefined4 uVar3;
  uint uVar4;
  MouseEventSource MVar5;
  QMouseEvent *pQVar6;
  ulong uVar7;
  QWidget *pQVar8;
  Data *pDVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar11 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar12 [16];
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->pressDelayEvent).d == (QMouseEvent *)0x0) {
    pQVar6 = copyMouseEvent(e);
    pQVar1 = (this->pressDelayEvent).d;
    if ((pQVar1 != pQVar6) && ((this->pressDelayEvent).d = pQVar6, pQVar1 != (QMouseEvent *)0x0)) {
      (**(code **)(*(long *)pQVar1 + 8))();
    }
    QBasicTimer::start(&this->pressDelayTimer,(long)delay * 1000000,1,this);
    uVar3 = QEventPoint::globalPosition();
    auVar12._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar12._8_8_ =
         (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa;
    auVar12 = minpd(_DAT_0066f5d0,auVar12);
    auVar11._8_8_ = -(ulong)(-2147483648.0 < auVar12._8_8_);
    auVar11._0_8_ = -(ulong)(-2147483648.0 < auVar12._0_8_);
    uVar4 = movmskpd(uVar3,auVar11);
    uVar10 = 0x8000000000000000;
    if ((uVar4 & 1) != 0) {
      uVar10 = (ulong)(uint)(int)auVar12._0_8_ << 0x20;
    }
    uVar7 = 0x80000000;
    if ((uVar4 & 2) != 0) {
      uVar7 = (ulong)(uint)(int)auVar12._8_8_;
    }
    local_30 = (QPoint)(uVar7 | uVar10);
    pQVar8 = QApplication::widgetAt(&local_30);
    if (pQVar8 == (QWidget *)0x0) {
      pDVar9 = (Data *)0x0;
    }
    else {
      pDVar9 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar8->super_QObject);
    }
    pDVar2 = (this->mouseTarget).wp.d;
    (this->mouseTarget).wp.d = pDVar9;
    (this->mouseTarget).wp.value = &pQVar8->super_QObject;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if (*(int *)pDVar2 == 0) {
        operator_delete(pDVar2);
      }
    }
    this->mouseButton = *(MouseButton *)((this->pressDelayEvent).d + 0x40);
    MVar5 = QMouseEvent::source();
    this->mouseEventSource = MVar5;
  }
  (**(code **)(*(long *)e + 0x10))(e,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void pressed(QEvent *e, int delay)
    {
        if (!pressDelayEvent) {
            pressDelayEvent.reset(copyMouseEvent(e));
            using namespace std::chrono_literals;
            pressDelayTimer.start(delay * 1ms, this);
            mouseTarget = QApplication::widgetAt(pressDelayEvent->globalPosition().toPoint());
            mouseButton = pressDelayEvent->button();
            mouseEventSource = pressDelayEvent->source();
            qFGDebug("QFG: consuming/delaying mouse press");
        } else {
            qFGDebug("QFG: NOT consuming/delaying mouse press");
        }
        e->setAccepted(true);
    }